

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecsscan.c
# Opt level: O3

void thecl_yy_flush_buffer(YY_BUFFER_STATE b)

{
  YY_BUFFER_STATE pyVar1;
  
  if (b != (YY_BUFFER_STATE)0x0) {
    pyVar1 = (YY_BUFFER_STATE)0x0;
    b->yy_n_chars = 0;
    *b->yy_ch_buf = '\0';
    b->yy_ch_buf[1] = '\0';
    b->yy_buf_pos = b->yy_ch_buf;
    b->yy_at_bol = 1;
    b->yy_buffer_status = 0;
    if (yy_buffer_stack != (YY_BUFFER_STATE *)0x0) {
      pyVar1 = yy_buffer_stack[yy_buffer_stack_top];
    }
    if (pyVar1 == b) {
      yy_n_chars = yy_buffer_stack[yy_buffer_stack_top]->yy_n_chars;
      yy_c_buf_p = yy_buffer_stack[yy_buffer_stack_top]->yy_buf_pos;
      thecl_yytext = yy_c_buf_p;
      thecl_yyin = yy_buffer_stack[yy_buffer_stack_top]->yy_input_file;
      yy_hold_char = *yy_c_buf_p;
      return;
    }
  }
  return;
}

Assistant:

void yy_flush_buffer (YY_BUFFER_STATE  b )
{
    	if ( ! b )
		return;

	b->yy_n_chars = 0;

	/* We always need two end-of-buffer characters.  The first causes
	 * a transition to the end-of-buffer state.  The second causes
	 * a jam in that state.
	 */
	b->yy_ch_buf[0] = YY_END_OF_BUFFER_CHAR;
	b->yy_ch_buf[1] = YY_END_OF_BUFFER_CHAR;

	b->yy_buf_pos = &b->yy_ch_buf[0];

	b->yy_at_bol = 1;
	b->yy_buffer_status = YY_BUFFER_NEW;

	if ( b == YY_CURRENT_BUFFER )
		yy_load_buffer_state(  );
}